

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O0

bool draco::DecodeSymbols
               (uint32_t num_values,int num_components,DecoderBuffer *src_buffer,
               uint32_t *out_values)

{
  bool bVar1;
  uint32_t *in_RCX;
  DecoderBuffer *in_RDX;
  int in_EDI;
  uint8_t scheme;
  uint32_t *in_stack_00000078;
  DecoderBuffer *in_stack_00000080;
  int in_stack_0000008c;
  uint32_t in_stack_00000090;
  undefined1 local_21;
  uint32_t in_stack_fffffffffffffff0;
  undefined1 local_1;
  
  if (in_EDI == 0) {
    local_1 = true;
  }
  else {
    bVar1 = DecoderBuffer::Decode<unsigned_char>(in_RDX,(uchar *)in_RCX);
    if (bVar1) {
      if (local_21 == '\0') {
        local_1 = DecodeTaggedSymbols<draco::RAnsSymbolDecoder>
                            (in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078
                            );
      }
      else if (local_21 == '\x01') {
        local_1 = DecodeRawSymbols<draco::RAnsSymbolDecoder>
                            (in_stack_fffffffffffffff0,in_RDX,in_RCX);
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool DecodeSymbols(uint32_t num_values, int num_components,
                   DecoderBuffer *src_buffer, uint32_t *out_values) {
  if (num_values == 0) {
    return true;
  }
  // Decode which scheme to use.
  uint8_t scheme;
  if (!src_buffer->Decode(&scheme)) {
    return false;
  }
  if (scheme == SYMBOL_CODING_TAGGED) {
    return DecodeTaggedSymbols<RAnsSymbolDecoder>(num_values, num_components,
                                                  src_buffer, out_values);
  } else if (scheme == SYMBOL_CODING_RAW) {
    return DecodeRawSymbols<RAnsSymbolDecoder>(num_values, src_buffer,
                                               out_values);
  }
  return false;
}